

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_-1,_1,_true>_>,_3,_0>
       ::run(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>_>
             *mat,scalar_sum_op<double> *func)

{
  scalar_sum_op<double> *in_RSI;
  undefined1 uVar1;
  PacketScalar adVar2;
  double adVar3 [2];
  Index index_3;
  Index index_2;
  Index index_1;
  Index index;
  PacketScalar packet_res1;
  PacketScalar packet_res0;
  Scalar res;
  Index alignedEnd;
  Index alignedEnd2;
  Index alignedSize;
  Index alignedSize2;
  Index alignedStart;
  Index packetSize;
  Index size;
  double (*in_stack_fffffffffffffed8) [2];
  scalar_sum_op<double> *in_stack_fffffffffffffee0;
  scalar_sum_op<double> *psVar4;
  Index in_stack_fffffffffffffee8;
  scalar_sum_op<double> *in_stack_fffffffffffffef0;
  scalar_sum_op<double> *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  Scalar local_e8;
  long local_e0;
  Scalar local_d8;
  long local_d0;
  Scalar local_c8;
  long local_c0;
  double local_b8;
  double local_a8;
  double local_98;
  long local_80;
  double local_78;
  double local_68;
  double local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  undefined8 local_20;
  Index local_18;
  scalar_sum_op<double> *local_10;
  
  local_10 = in_RSI;
  local_18 = EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_-1,_1,_true>_>_>
             ::size((EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>_>_>
                     *)in_stack_fffffffffffffee0);
  uVar1 = local_18 != 0;
  if ((bool)uVar1) {
    local_20 = 2;
    local_28 = first_aligned<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>const>const,1,_1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>,_1,_1,false>const,_1,1,true>const>>
                         ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>_>
                           *)0x2ecdd9);
    local_30 = ((local_18 - local_28) / 4) * 4;
    local_38 = ((local_18 - local_28) / 2) * 2;
    local_40 = local_28 + local_30;
    local_48 = local_28 + local_38;
    if (local_38 == 0) {
      local_50 = CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_-1,_1,_true>,_Eigen::Dense>
                 ::coeff((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_Eigen::Dense>
                          *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      for (local_e0 = 1; local_e0 < local_18; local_e0 = local_e0 + 1) {
        psVar4 = local_10;
        local_e8 = CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_-1,_1,_true>,_Eigen::Dense>
                   ::coeff((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_Eigen::Dense>
                            *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        local_50 = scalar_sum_op<double>::operator()(psVar4,&local_50,&local_e8);
      }
    }
    else {
      adVar2 = CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_-1,_1,_true>,_Eigen::Dense>
               ::packet<0>((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_Eigen::Dense>
                            *)CONCAT17(uVar1,in_stack_ffffffffffffff10),
                           (Index)in_stack_ffffffffffffff08);
      local_68 = adVar2[0];
      if (2 < local_38) {
        adVar2 = CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_-1,_1,_true>,_Eigen::Dense>
                 ::packet<0>((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_Eigen::Dense>
                              *)CONCAT17(uVar1,in_stack_ffffffffffffff10),
                             (Index)in_stack_ffffffffffffff08);
        local_78 = adVar2[0];
        local_80 = local_28;
        while (local_80 = local_80 + 4, local_80 < local_40) {
          adVar2 = CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_-1,_1,_true>,_Eigen::Dense>
                   ::packet<0>((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_Eigen::Dense>
                                *)CONCAT17(uVar1,in_stack_ffffffffffffff10),
                               (Index)in_stack_ffffffffffffff08);
          local_98 = adVar2[0];
          adVar3 = scalar_sum_op<double>::packetOp<double__vector(2)>
                             (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                              (double (*) [2])0x2ecf29);
          local_68 = adVar3[0];
          in_stack_ffffffffffffff08 = local_10;
          adVar2 = CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_-1,_1,_true>,_Eigen::Dense>
                   ::packet<0>((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_Eigen::Dense>
                                *)CONCAT17(uVar1,in_stack_ffffffffffffff10),(Index)local_10);
          local_a8 = adVar2[0];
          adVar3 = scalar_sum_op<double>::packetOp<double__vector(2)>
                             (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                              (double (*) [2])0x2ecf7b);
          local_78 = adVar3[0];
        }
        adVar3 = scalar_sum_op<double>::packetOp<double__vector(2)>
                           (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                            (double (*) [2])0x2ecfba);
        local_68 = adVar3[0];
        if (local_40 < local_48) {
          adVar2 = CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_-1,_1,_true>,_Eigen::Dense>
                   ::packet<0>((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_Eigen::Dense>
                                *)CONCAT17(uVar1,in_stack_ffffffffffffff10),
                               (Index)in_stack_ffffffffffffff08);
          local_b8 = adVar2[0];
          adVar3 = scalar_sum_op<double>::packetOp<double__vector(2)>
                             (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                              (double (*) [2])0x2ed014);
          local_68 = adVar3[0];
        }
      }
      local_50 = scalar_sum_op<double>::predux<double__vector(2)>
                           (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      for (local_c0 = 0; local_c0 < local_28; local_c0 = local_c0 + 1) {
        in_stack_fffffffffffffef0 = local_10;
        local_c8 = CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_-1,_1,_true>,_Eigen::Dense>
                   ::coeff((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_Eigen::Dense>
                            *)local_10,in_stack_fffffffffffffee8);
        local_50 = scalar_sum_op<double>::operator()(in_stack_fffffffffffffef0,&local_50,&local_c8);
      }
      for (local_d0 = local_48; local_d0 < local_18; local_d0 = local_d0 + 1) {
        psVar4 = local_10;
        local_d8 = CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_-1,_1,_true>,_Eigen::Dense>
                   ::coeff((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_Eigen::Dense>
                            *)in_stack_fffffffffffffef0,(Index)local_10);
        local_50 = scalar_sum_op<double>::operator()(psVar4,&local_50,&local_d8);
      }
    }
    return local_50;
  }
  __assert_fail("size && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Redux.h"
                ,0xca,
                "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<double>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, 1, true>, -1, 1>>, 1, -1, true>>, const Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>>>, -1, 1, true>>>::run(const Derived &, const Func &) [Func = Eigen::internal::scalar_sum_op<double>, Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, 1, true>, -1, 1>>, 1, -1, true>>, const Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>>>, -1, 1, true>>, Traversal = 3, Unrolling = 0]"
               );
}

Assistant:

static Scalar run(const Derived& mat, const Func& func)
  {
    const Index size = mat.size();
    eigen_assert(size && "you are using an empty matrix");
    const Index packetSize = packet_traits<Scalar>::size;
    const Index alignedStart = internal::first_aligned(mat);
    enum {
      alignment = bool(Derived::Flags & DirectAccessBit) || bool(Derived::Flags & AlignedBit)
                ? Aligned : Unaligned
    };
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = mat.template packet<alignment>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = mat.template packet<alignment>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment>(index));
          packet_res1 = func.packetOp(packet_res1, mat.template packet<alignment>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,mat.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,mat.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = mat.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,mat.coeff(index));
    }

    return res;
  }